

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<int,_int>::iterator,_google::protobuf::Map<int,_int>::iterator> *
__thiscall
google::protobuf::Map<int,_int>::equal_range<int>
          (pair<google::protobuf::Map<int,_int>::iterator,_google::protobuf::Map<int,_int>::iterator>
           *__return_storage_ptr__,Map<int,_int> *this,key_arg<int> *key)

{
  NodeAndBucket NVar1;
  iterator it;
  UntypedMapIterator local_28;
  
  NVar1 = internal::KeyMapBase<unsigned_int>::FindHelper(&this->super_KeyMapBase<unsigned_int>,*key)
  ;
  local_28.node_ = NVar1.node;
  local_28.bucket_index_ = NVar1.bucket;
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = local_28.node_;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  *(ulong *)&(__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ =
       CONCAT44(local_28._20_4_,local_28.bucket_index_);
  local_28.m_ = (UntypedMapBase *)this;
  if (local_28.node_ != (NodeBase *)0x0) {
    internal::UntypedMapIterator::PlusPlus(&local_28);
  }
  *(ulong *)&(__return_storage_ptr__->second).super_UntypedMapIterator.bucket_index_ =
       CONCAT44(local_28._20_4_,local_28.bucket_index_);
  (__return_storage_ptr__->second).super_UntypedMapIterator.node_ = local_28.node_;
  (__return_storage_ptr__->second).super_UntypedMapIterator.m_ = local_28.m_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    iterator it = find(key);
    if (it == end()) {
      return std::pair<iterator, iterator>(it, it);
    } else {
      iterator begin = it++;
      return std::pair<iterator, iterator>(begin, it);
    }
  }